

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O3

void __thiscall r_exec::_Fact::set_opposite(_Fact *this)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Atom *this_00;
  Atom local_10 [4];
  Atom local_c [4];
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,0);
  sVar1 = r_code::Atom::asOpcode();
  if (sVar1 == Opcodes::Fact) {
    r_code::Atom::Object((ushort)local_c,(uchar)Opcodes::AntiFact);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,0);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_c);
    this_00 = local_c;
  }
  else {
    r_code::Atom::Object((ushort)local_10,(uchar)Opcodes::Fact);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,0);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar2),local_10);
    this_00 = local_10;
  }
  r_code::Atom::~Atom(this_00);
  return;
}

Assistant:

void _Fact::set_opposite()
{
    if (is_fact()) {
        code(0) = Atom::Object(Opcodes::AntiFact, FACT_ARITY);
    } else {
        code(0) = Atom::Object(Opcodes::Fact, FACT_ARITY);
    }
}